

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hasshe2.c
# Opt level: O0

void hasshe2(void *input_buf,int n_bytes,uint32_t seed,void *output_state)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 *in_RCX;
  int in_ESI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m128i state_2;
  __m128i state_1;
  __m128i input;
  __m128i rnd_data;
  __m128i coeffs_2;
  __m128i coeffs_1;
  undefined1 local_718 [16];
  undefined1 local_708 [6] [16];
  int local_6a4;
  undefined1 (*local_6a0) [16];
  ulong local_3b8;
  ulong uStack_3b0;
  ulong local_398;
  ulong uStack_390;
  ulong local_378;
  ulong uStack_370;
  ulong local_358;
  ulong uStack_350;
  ulong local_338;
  ulong uStack_330;
  ulong local_318;
  ulong uStack_310;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2d8;
  ulong uStack_2d0;
  
  if (in_ESI % 0x10 == 0) {
    local_718._8_8_ = coeffs._40_8_;
    local_718._0_8_ = coeffs._32_8_;
    local_708[0]._8_8_ = coeffs._40_8_;
    local_708[0]._0_8_ = coeffs._32_8_;
    local_6a4 = in_ESI;
    local_6a0 = in_RDI;
    while (0xf < local_6a4) {
      auVar2 = *local_6a0;
      auVar1 = *local_6a0;
      auVar13 = *local_6a0;
      auVar12 = *local_6a0;
      local_6a0 = local_6a0 + 1;
      local_6a4 = local_6a4 + -0x10;
      auVar12 = vpunpckhdq_avx(auVar12,auVar13);
      auVar4._8_8_ = coeffs._8_8_;
      auVar4._0_8_ = coeffs._0_8_;
      auVar12 = vpmuludq_avx(auVar4,auVar12);
      auVar13 = vpsubq_avx(local_708[0],auVar12);
      auVar12 = vpunpckldq_avx(auVar1,auVar2);
      auVar3._8_8_ = coeffs._24_8_;
      auVar3._0_8_ = coeffs._16_8_;
      auVar12 = vpmuludq_avx(auVar3,auVar12);
      auVar1 = vpsubq_avx(local_718,auVar12);
      local_708[0]._0_8_ = auVar13._0_8_;
      local_708[0]._8_8_ = auVar13._8_8_;
      auVar12 = vpsrlq_avx(auVar13,ZEXT416(0x1d));
      local_2d8 = auVar12._0_8_;
      uStack_2d0 = auVar12._8_8_;
      local_718._0_8_ = auVar1._0_8_;
      local_718._8_8_ = auVar1._8_8_;
      auVar12 = vpsrlq_avx(auVar1,ZEXT416(0x1d));
      local_2f8 = auVar12._0_8_;
      uStack_2f0 = auVar12._8_8_;
      auVar11._8_8_ = local_708[0]._8_8_ ^ uStack_2d0;
      auVar11._0_8_ = local_708[0]._0_8_ ^ local_2d8;
      auVar12 = vpsllq_avx(auVar11,ZEXT416(0x10));
      auVar8._8_8_ = local_708[0]._8_8_ ^ uStack_2d0;
      auVar8._0_8_ = local_708[0]._0_8_ ^ local_2d8;
      auVar12 = vpaddq_avx(auVar8,auVar12);
      auVar10._8_8_ = local_718._8_8_ ^ uStack_2f0;
      auVar10._0_8_ = local_718._0_8_ ^ local_2f8;
      auVar13 = vpsllq_avx(auVar10,ZEXT416(0x10));
      auVar7._8_8_ = local_718._8_8_ ^ uStack_2f0;
      auVar7._0_8_ = local_718._0_8_ ^ local_2f8;
      auVar13 = vpaddq_avx(auVar7,auVar13);
      local_708[0]._0_8_ = auVar12._0_8_;
      local_708[0]._8_8_ = auVar12._8_8_;
      auVar12 = vpsrlq_avx(auVar12,ZEXT416(0x15));
      local_318 = auVar12._0_8_;
      uStack_310 = auVar12._8_8_;
      local_708[0]._8_8_ = local_708[0]._8_8_ ^ uStack_310;
      local_708[0]._0_8_ = local_708[0]._0_8_ ^ local_318;
      local_718._0_8_ = auVar13._0_8_;
      local_718._8_8_ = auVar13._8_8_;
      auVar12 = vpsrlq_avx(auVar13,ZEXT416(0x15));
      local_338 = auVar12._0_8_;
      uStack_330 = auVar12._8_8_;
      local_718._8_8_ = local_718._8_8_ ^ uStack_330;
      local_718._0_8_ = local_718._0_8_ ^ local_338;
      auVar12 = vpslldq_avx(local_708[0],4);
      auVar12 = vpaddq_avx(local_708[0],auVar12);
      auVar13 = vpslldq_avx(local_718,4);
      auVar13 = vpaddq_avx(local_718,auVar13);
      auVar1 = vpsubq_avx(auVar12,auVar13);
      auVar12 = vpshufd_avx(auVar13,0x39);
      auVar13 = vpsubq_avx(auVar12,auVar1);
      auVar12 = vpshufd_avx(auVar1,0x1e);
      auVar1 = vpsubq_avx(auVar12,auVar13);
      auVar12 = vpshufd_avx(auVar13,0x93);
      local_718 = vpsubq_avx(auVar12,auVar1);
      auVar12 = vpshufd_avx(auVar1,0x93);
      local_708[0] = vpsubq_avx(auVar12,local_718);
    }
    auVar12 = vpunpckhdq_avx(local_708[0],local_708[0]);
    auVar2._8_8_ = coeffs._8_8_;
    auVar2._0_8_ = coeffs._0_8_;
    auVar12 = vpmuludq_avx(auVar2,auVar12);
    auVar13._8_8_ = coeffs._40_8_;
    auVar13._0_8_ = coeffs._32_8_;
    auVar13 = vpsubq_avx(auVar13,auVar12);
    auVar12 = vpunpckldq_avx(local_708[0],local_708[0]);
    auVar1._8_8_ = coeffs._24_8_;
    auVar1._0_8_ = coeffs._16_8_;
    auVar12 = vpmuludq_avx(auVar1,auVar12);
    auVar1 = vpsubq_avx(local_718,auVar12);
    local_708[0]._0_8_ = auVar13._0_8_;
    local_708[0]._8_8_ = auVar13._8_8_;
    auVar12 = vpsrlq_avx(auVar13,ZEXT416(0x1d));
    local_358 = auVar12._0_8_;
    uStack_350 = auVar12._8_8_;
    local_718._0_8_ = auVar1._0_8_;
    local_718._8_8_ = auVar1._8_8_;
    auVar12 = vpsrlq_avx(auVar1,ZEXT416(0x1d));
    local_378 = auVar12._0_8_;
    uStack_370 = auVar12._8_8_;
    auVar12._8_8_ = local_708[0]._8_8_ ^ uStack_350;
    auVar12._0_8_ = local_708[0]._0_8_ ^ local_358;
    auVar12 = vpsllq_avx(auVar12,ZEXT416(0x10));
    auVar6._8_8_ = local_708[0]._8_8_ ^ uStack_350;
    auVar6._0_8_ = local_708[0]._0_8_ ^ local_358;
    auVar12 = vpaddq_avx(auVar6,auVar12);
    auVar9._8_8_ = local_718._8_8_ ^ uStack_370;
    auVar9._0_8_ = local_718._0_8_ ^ local_378;
    auVar13 = vpsllq_avx(auVar9,ZEXT416(0x10));
    auVar5._8_8_ = local_718._8_8_ ^ uStack_370;
    auVar5._0_8_ = local_718._0_8_ ^ local_378;
    auVar13 = vpaddq_avx(auVar5,auVar13);
    local_708[0]._0_8_ = auVar12._0_8_;
    local_708[0]._8_8_ = auVar12._8_8_;
    auVar12 = vpsrlq_avx(auVar12,ZEXT416(0x15));
    local_398 = auVar12._0_8_;
    uStack_390 = auVar12._8_8_;
    local_708[0]._8_8_ = local_708[0]._8_8_ ^ uStack_390;
    local_708[0]._0_8_ = local_708[0]._0_8_ ^ local_398;
    local_718._0_8_ = auVar13._0_8_;
    local_718._8_8_ = auVar13._8_8_;
    auVar12 = vpsrlq_avx(auVar13,ZEXT416(0x15));
    local_3b8 = auVar12._0_8_;
    uStack_3b0 = auVar12._8_8_;
    local_718._8_8_ = local_718._8_8_ ^ uStack_3b0;
    local_718._0_8_ = local_718._0_8_ ^ local_3b8;
    auVar12 = vpslldq_avx(local_708[0],4);
    auVar12 = vpaddq_avx(local_708[0],auVar12);
    auVar13 = vpslldq_avx(local_718,4);
    auVar13 = vpaddq_avx(local_718,auVar13);
    auVar1 = vpsubq_avx(auVar12,auVar13);
    auVar12 = vpshufd_avx(auVar13,0x39);
    auVar13 = vpsubq_avx(auVar12,auVar1);
    auVar12 = vpshufd_avx(auVar1,0x1e);
    auVar1 = vpsubq_avx(auVar12,auVar13);
    auVar12 = vpshufd_avx(auVar13,0x93);
    auVar13 = vpsubq_avx(auVar12,auVar1);
    auVar12 = vpshufd_avx(auVar1,0x93);
    local_718._0_8_ = auVar13._0_8_;
    local_718._8_8_ = auVar13._8_8_;
    auVar12 = vpsubq_avx(auVar12,auVar13);
    local_708[0]._0_8_ = auVar12._0_8_;
    local_708[0]._8_8_ = auVar12._8_8_;
    *in_RCX = local_708[0]._0_8_;
    in_RCX[1] = local_708[0]._8_8_;
    in_RCX[2] = local_718._0_8_;
    in_RCX[3] = local_718._8_8_;
    return;
  }
  __assert_fail("n_bytes % 16 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/hasshe2.c"
                ,0x3d,"void hasshe2(const void *, int, uint32_t, void *)");
}

Assistant:

void hasshe2(const void *input_buf, int n_bytes, uint32_t seed, void *output_state)
{
  __m128i coeffs_1, coeffs_2, rnd_data, input, state_1, state_2;

  assert(n_bytes % 16 == 0);

  coeffs_1 = _mm_load_si128((void *) coeffs);
  coeffs_2 = _mm_load_si128((void *) (coeffs + 4));
  rnd_data = _mm_load_si128((void *) (coeffs + 8));

  /* Initialize internal state to something random.  (Alternatively,
     if hashing a chain of data, read in the previous hash result from
     somewhere.) */
  state_1 = state_2 = rnd_data;

  while (n_bytes >= 16) {
    /* Read in 16 bytes, or 128 bits, from buf.  Advance buf and
       decrement n_bytes accordingly. */
    input = _mm_loadu_si128((void *) input_buf);
    input_buf += 16;
    n_bytes -= 16;

    COMBINE_AND_MIX(coeffs_1, coeffs_2, state_1, state_2, input);
  }

  /* Postprocessing.  Copy half of the internal state into fake input,
     replace it with the constant rnd_data, and do one combine and mix
     phase more. */ 
  input = state_1;
  state_1 = rnd_data;
  COMBINE_AND_MIX(coeffs_1, coeffs_2, state_1, state_2, input);

  _mm_storeu_si128((void *) output_state, state_1);
  _mm_storeu_si128((void *) (output_state + 16), state_2);
}